

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void fadst4x4_sse4_1(__m128i *in,__m128i *out,int bit,int num_col)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int32_t *piVar11;
  int in_ECX;
  uint in_EDX;
  undefined8 *in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int idx;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  __m128i x3;
  __m128i x2;
  __m128i x1;
  __m128i x0;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m128i t;
  __m128i sinpi4;
  __m128i sinpi3;
  __m128i sinpi2;
  __m128i sinpi1;
  __m128i rnding;
  int32_t *sinpi;
  char local_41c;
  int local_3b8;
  int iStack_3b4;
  int iStack_3b0;
  int iStack_3ac;
  int local_368;
  int iStack_364;
  int iStack_360;
  int iStack_35c;
  int local_348;
  int iStack_344;
  int iStack_340;
  int iStack_33c;
  int local_328;
  int iStack_324;
  int iStack_320;
  int iStack_31c;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2f8;
  int iStack_2f4;
  int iStack_2f0;
  int iStack_2ec;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2d8;
  int iStack_2d4;
  int iStack_2d0;
  int iStack_2cc;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  
  piVar11 = sinpi_arr(in_EDX);
  local_41c = (char)in_EDX;
  iVar10 = 1 << (local_41c - 1U & 0x1f);
  iVar1 = piVar11[1];
  iVar2 = piVar11[2];
  iVar3 = piVar11[3];
  iVar4 = piVar11[4];
  auVar8._8_8_ = CONCAT44(iVar1,iVar1);
  auVar8._0_8_ = CONCAT44(iVar1,iVar1);
  auVar12 = pmulld(*in_RDI,auVar8);
  auVar13._8_8_ = CONCAT44(iVar4,iVar4);
  auVar13._0_8_ = CONCAT44(iVar4,iVar4);
  auVar13 = pmulld(*in_RDI,auVar13);
  uVar5 = *(undefined8 *)in_RDI[in_ECX];
  uVar6 = *(undefined8 *)(in_RDI[in_ECX] + 8);
  local_2d8 = (int)*(undefined8 *)*in_RDI;
  iStack_2d4 = (int)((ulong)*(undefined8 *)*in_RDI >> 0x20);
  iStack_2d0 = (int)*(undefined8 *)(*in_RDI + 8);
  iStack_2cc = (int)((ulong)*(undefined8 *)(*in_RDI + 8) >> 0x20);
  local_2e8 = (int)uVar5;
  iStack_2e4 = (int)((ulong)uVar5 >> 0x20);
  iStack_2e0 = (int)uVar6;
  iStack_2dc = (int)((ulong)uVar6 >> 0x20);
  auVar7._8_8_ = CONCAT44(iVar2,iVar2);
  auVar7._0_8_ = CONCAT44(iVar2,iVar2);
  auVar14 = pmulld(in_RDI[in_ECX],auVar7);
  auVar15._8_8_ = CONCAT44(iVar1,iVar1);
  auVar15._0_8_ = CONCAT44(iVar1,iVar1);
  auVar15 = pmulld(in_RDI[in_ECX],auVar15);
  auVar16._8_8_ = CONCAT44(iVar3,iVar3);
  auVar16._0_8_ = CONCAT44(iVar3,iVar3);
  auVar16 = pmulld(in_RDI[in_ECX * 2],auVar16);
  iVar9 = in_ECX * 3;
  auVar17._8_8_ = CONCAT44(iVar4,iVar4);
  auVar17._0_8_ = CONCAT44(iVar4,iVar4);
  auVar17 = pmulld(in_RDI[iVar9],auVar17);
  auVar18._8_8_ = CONCAT44(iVar2,iVar2);
  auVar18._0_8_ = CONCAT44(iVar2,iVar2);
  auVar18 = pmulld(in_RDI[iVar9],auVar18);
  uVar5 = *(undefined8 *)in_RDI[iVar9];
  uVar6 = *(undefined8 *)(in_RDI[iVar9] + 8);
  local_268 = (int)uVar5;
  iStack_264 = (int)((ulong)uVar5 >> 0x20);
  iStack_260 = (int)uVar6;
  iStack_25c = (int)((ulong)uVar6 >> 0x20);
  local_2f8 = auVar12._0_4_;
  iStack_2f4 = auVar12._4_4_;
  iStack_2f0 = auVar12._8_4_;
  iStack_2ec = auVar12._12_4_;
  local_308 = auVar14._0_4_;
  iStack_304 = auVar14._4_4_;
  iStack_300 = auVar14._8_4_;
  iStack_2fc = auVar14._12_4_;
  local_328 = auVar17._0_4_;
  iStack_324 = auVar17._4_4_;
  iStack_320 = auVar17._8_4_;
  iStack_31c = auVar17._12_4_;
  local_328 = local_2f8 + local_308 + local_328;
  iStack_324 = iStack_2f4 + iStack_304 + iStack_324;
  iStack_320 = iStack_2f0 + iStack_300 + iStack_320;
  iStack_31c = iStack_2ec + iStack_2fc + iStack_31c;
  auVar14._4_4_ = (iStack_2d4 + iStack_2e4) - iStack_264;
  auVar14._0_4_ = (local_2d8 + local_2e8) - local_268;
  auVar14._12_4_ = (iStack_2cc + iStack_2dc) - iStack_25c;
  auVar14._8_4_ = (iStack_2d0 + iStack_2e0) - iStack_260;
  auVar12._8_8_ = CONCAT44(iVar3,iVar3);
  auVar12._0_8_ = CONCAT44(iVar3,iVar3);
  auVar12 = pmulld(auVar14,auVar12);
  local_278 = auVar13._0_4_;
  iStack_274 = auVar13._4_4_;
  iStack_270 = auVar13._8_4_;
  iStack_26c = auVar13._12_4_;
  local_288 = auVar15._0_4_;
  iStack_284 = auVar15._4_4_;
  iStack_280 = auVar15._8_4_;
  iStack_27c = auVar15._12_4_;
  local_348 = auVar18._0_4_;
  iStack_344 = auVar18._4_4_;
  iStack_340 = auVar18._8_4_;
  iStack_33c = auVar18._12_4_;
  local_348 = (local_278 - local_288) + local_348;
  iStack_344 = (iStack_274 - iStack_284) + iStack_344;
  iStack_340 = (iStack_270 - iStack_280) + iStack_340;
  iStack_33c = (iStack_26c - iStack_27c) + iStack_33c;
  local_368 = auVar16._0_4_;
  iStack_364 = auVar16._4_4_;
  iStack_360 = auVar16._8_4_;
  iStack_35c = auVar16._12_4_;
  auVar14 = ZEXT416(in_EDX);
  local_3b8 = auVar12._0_4_;
  iStack_3b4 = auVar12._4_4_;
  iStack_3b0 = auVar12._8_4_;
  iStack_3ac = auVar12._12_4_;
  auVar12 = ZEXT416(in_EDX);
  auVar18 = ZEXT416(in_EDX);
  auVar17 = ZEXT416(in_EDX);
  *in_RSI = CONCAT44(iStack_324 + iStack_364 + iVar10 >> auVar14,
                     local_328 + local_368 + iVar10 >> auVar14);
  in_RSI[1] = CONCAT44(iStack_31c + iStack_35c + iVar10 >> auVar14,
                       iStack_320 + iStack_360 + iVar10 >> auVar14);
  in_RSI[2] = CONCAT44(iStack_3b4 + iVar10 >> auVar12,local_3b8 + iVar10 >> auVar12);
  in_RSI[3] = CONCAT44(iStack_3ac + iVar10 >> auVar12,iStack_3b0 + iVar10 >> auVar12);
  in_RSI[4] = CONCAT44((iStack_344 - iStack_364) + iVar10 >> auVar18,
                       (local_348 - local_368) + iVar10 >> auVar18);
  in_RSI[5] = CONCAT44((iStack_33c - iStack_35c) + iVar10 >> auVar18,
                       (iStack_340 - iStack_360) + iVar10 >> auVar18);
  in_RSI[6] = CONCAT44((iStack_344 - iStack_324) + iStack_364 + iVar10 >> auVar17,
                       (local_348 - local_328) + local_368 + iVar10 >> auVar17);
  in_RSI[7] = CONCAT44((iStack_33c - iStack_31c) + iStack_35c + iVar10 >> auVar17,
                       (iStack_340 - iStack_320) + iStack_360 + iVar10 >> auVar17);
  return;
}

Assistant:

static void fadst4x4_sse4_1(__m128i *in, __m128i *out, int bit,
                            const int num_col) {
  const int32_t *sinpi = sinpi_arr(bit);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const __m128i sinpi1 = _mm_set1_epi32((int)sinpi[1]);
  const __m128i sinpi2 = _mm_set1_epi32((int)sinpi[2]);
  const __m128i sinpi3 = _mm_set1_epi32((int)sinpi[3]);
  const __m128i sinpi4 = _mm_set1_epi32((int)sinpi[4]);
  __m128i t;
  __m128i s0, s1, s2, s3, s4, s5, s6, s7;
  __m128i x0, x1, x2, x3;
  __m128i u0, u1, u2, u3;

  int idx = 0 * num_col;
  s0 = _mm_mullo_epi32(in[idx], sinpi1);
  s1 = _mm_mullo_epi32(in[idx], sinpi4);
  t = _mm_add_epi32(in[idx], in[idx + num_col]);
  idx += num_col;
  s2 = _mm_mullo_epi32(in[idx], sinpi2);
  s3 = _mm_mullo_epi32(in[idx], sinpi1);
  idx += num_col;
  s4 = _mm_mullo_epi32(in[idx], sinpi3);
  idx += num_col;
  s5 = _mm_mullo_epi32(in[idx], sinpi4);
  s6 = _mm_mullo_epi32(in[idx], sinpi2);
  s7 = _mm_sub_epi32(t, in[idx]);

  t = _mm_add_epi32(s0, s2);
  x0 = _mm_add_epi32(t, s5);
  x1 = _mm_mullo_epi32(s7, sinpi3);
  t = _mm_sub_epi32(s1, s3);
  x2 = _mm_add_epi32(t, s6);
  x3 = s4;

  s0 = _mm_add_epi32(x0, x3);
  s1 = x1;
  s2 = _mm_sub_epi32(x2, x3);
  t = _mm_sub_epi32(x2, x0);
  s3 = _mm_add_epi32(t, x3);

  u0 = _mm_add_epi32(s0, rnding);
  u0 = _mm_srai_epi32(u0, bit);

  u1 = _mm_add_epi32(s1, rnding);
  u1 = _mm_srai_epi32(u1, bit);

  u2 = _mm_add_epi32(s2, rnding);
  u2 = _mm_srai_epi32(u2, bit);

  u3 = _mm_add_epi32(s3, rnding);
  u3 = _mm_srai_epi32(u3, bit);

  out[0] = u0;
  out[1] = u1;
  out[2] = u2;
  out[3] = u3;
}